

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O2

void __thiscall RTVector3::accelToEuler(RTVector3 *this,RTVector3 *rollPitchYaw)

{
  RTFLOAT RVar1;
  RTFLOAT RVar2;
  float fVar3;
  RTVector3 normAccel;
  RTVector3 local_20;
  
  local_20.m_data[2] = this->m_data[2];
  local_20.m_data._0_8_ = *(undefined8 *)this->m_data;
  normalize(&local_20);
  RVar2 = local_20.m_data[2];
  RVar1 = local_20.m_data[1];
  fVar3 = atan2f(local_20.m_data[1],local_20.m_data[2]);
  rollPitchYaw->m_data[0] = fVar3;
  fVar3 = atan2f(local_20.m_data[0],SQRT(RVar1 * RVar1 + RVar2 * RVar2));
  rollPitchYaw->m_data[1] = -fVar3;
  rollPitchYaw->m_data[2] = 0.0;
  return;
}

Assistant:

void RTVector3::accelToEuler(RTVector3& rollPitchYaw) const
{
    RTVector3 normAccel = *this;

    normAccel.normalize();

    rollPitchYaw.setX(atan2(normAccel.y(), normAccel.z()));
    rollPitchYaw.setY(-atan2(normAccel.x(), sqrt(normAccel.y() * normAccel.y() + normAccel.z() * normAccel.z())));
    rollPitchYaw.setZ(0);
}